

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O3

void __thiscall indk::NeuralNet::doPrepare(NeuralNet *this)

{
  _Rb_tree_node_base *p_Var1;
  
  this->t = 0;
  for (p_Var1 = (this->Neurons)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->Neurons)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    Neuron::doPrepare(*(Neuron **)(p_Var1 + 2));
  }
  return;
}

Assistant:

void indk::NeuralNet::doPrepare() {
    t = 0;
    for (const auto& N: Neurons) N.second -> doPrepare();
}